

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.cc
# Opt level: O1

JsonObjectWriter * __thiscall
google::protobuf::util::converter::JsonObjectWriter::RenderFloat
          (JsonObjectWriter *this,StringPiece name,float value)

{
  StringPiece s;
  _Alloc_hider _Var1;
  int iVar2;
  undefined4 extraout_var;
  protobuf *this_00;
  string local_50;
  
  this_00 = (protobuf *)name.ptr_;
  if ((uint)ABS(value) < 0x7f800000) {
    SimpleFtoa_abi_cxx11_(&local_50,this_00,value);
    s.length_ = local_50._M_string_length;
    s.ptr_ = local_50._M_dataplus._M_p;
    if ((long)local_50._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_50._M_string_length,"size_t to int conversion");
    }
    WritePrefix(this,name);
    WriteRawString(this,s);
  }
  else {
    FloatAsString_abi_cxx11_(&local_50,(converter *)this_00,value);
    _Var1._M_p = local_50._M_dataplus._M_p;
    if ((long)local_50._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_50._M_string_length,"size_t to int conversion");
    }
    iVar2 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0xd])
                      (this,this_00,name.length_,_Var1._M_p,local_50._M_string_length);
    this = (JsonObjectWriter *)CONCAT44(extraout_var,iVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return this;
}

Assistant:

JsonObjectWriter* JsonObjectWriter::RenderFloat(StringPiece name,
                                                float value) {
  if (std::isfinite(value)) {
    return RenderSimple(name, SimpleFtoa(value));
  }

  // Render quoted with NaN/Infinity-aware FloatAsString.
  return RenderString(name, FloatAsString(value));
}